

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Reindex(Parse *pParse,Token *pName1,Token *pName2)

{
  byte bVar1;
  sqlite3 *db;
  Schema *pSVar2;
  Schema *pSVar3;
  int iVar4;
  uint uVar5;
  char *z;
  HashElem *pHVar6;
  Table *pTab;
  Index *pIndex;
  Schema **ppSVar7;
  char *zDatabase;
  long in_FS_OFFSET;
  Token *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  iVar4 = sqlite3ReadSchema(pParse);
  if (iVar4 == 0) {
    if (pName1 == (Token *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        reindexDatabases(pParse,(char *)0x0);
        return;
      }
      goto LAB_001753e5;
    }
    local_40 = (Token *)&DAT_aaaaaaaaaaaaaaaa;
    if ((pName2 == (Token *)0x0) || (pName2->z == (char *)0x0)) {
      z = sqlite3DbStrNDup(pParse->db,pName1->z,(ulong)pName1->n);
      sqlite3Dequote(z);
      if (z == (char *)0x0) goto LAB_0017518e;
      bVar1 = db->enc;
      pHVar6 = findElementWithHash(&db->aCollSeq,z,(uint *)0x0);
      if ((pHVar6->data != (void *)0x0) &&
         ((void *)((long)pHVar6->data + (ulong)bVar1 * 0x28) != (void *)0x28)) {
        reindexDatabases(pParse,z);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001753e5;
        goto LAB_0017531b;
      }
      sqlite3DbFreeNN(db,z);
    }
    uVar5 = sqlite3TwoPartName(pParse,pName1,pName2,&local_40);
    if ((-1 < (int)uVar5) && (z = sqlite3NameFromToken(db,local_40), z != (char *)0x0)) {
      if (pName2->n == 0) {
        zDatabase = (char *)0x0;
      }
      else {
        zDatabase = db->aDb[uVar5].zDbSName;
      }
      pTab = sqlite3FindTable(db,z,zDatabase);
      if (pTab == (Table *)0x0) {
        pIndex = sqlite3FindIndex(db,z,zDatabase);
        sqlite3DbFreeNN(db,z);
        if (pIndex == (Index *)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            sqlite3ErrorMsg(pParse,"unable to identify the object to be reindexed");
            return;
          }
        }
        else {
          pSVar2 = pIndex->pTable->pSchema;
          if (pSVar2 == (Schema *)0x0) {
            iVar4 = -0x8000;
          }
          else {
            iVar4 = -1;
            ppSVar7 = &db->aDb->pSchema;
            do {
              iVar4 = iVar4 + 1;
              pSVar3 = *ppSVar7;
              ppSVar7 = ppSVar7 + 4;
            } while (pSVar3 != pSVar2);
          }
          sqlite3BeginWriteOperation(pParse,0,iVar4);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            sqlite3RefillIndex(pParse,pIndex,-1);
            return;
          }
        }
      }
      else {
        reindexTable(pParse,pTab,(char *)0x0);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_0017531b:
          sqlite3DbFreeNN(db,z);
          return;
        }
      }
      goto LAB_001753e5;
    }
  }
LAB_0017518e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001753e5:
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3Reindex(Parse *pParse, Token *pName1, Token *pName2){
  CollSeq *pColl;             /* Collating sequence to be reindexed, or NULL */
  char *z;                    /* Name of a table or index */
  const char *zDb;            /* Name of the database */
  Table *pTab;                /* A table in the database */
  Index *pIndex;              /* An index associated with pTab */
  int iDb;                    /* The database index number */
  sqlite3 *db = pParse->db;   /* The database connection */
  Token *pObjName;            /* Name of the table or index to be reindexed */

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    return;
  }

  if( pName1==0 ){
    reindexDatabases(pParse, 0);
    return;
  }else if( NEVER(pName2==0) || pName2->z==0 ){
    char *zColl;
    assert( pName1->z );
    zColl = sqlite3NameFromToken(pParse->db, pName1);
    if( !zColl ) return;
    pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
    if( pColl ){
      reindexDatabases(pParse, zColl);
      sqlite3DbFree(db, zColl);
      return;
    }
    sqlite3DbFree(db, zColl);
  }
  iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pObjName);
  if( iDb<0 ) return;
  z = sqlite3NameFromToken(db, pObjName);
  if( z==0 ) return;
  zDb = pName2->n ? db->aDb[iDb].zDbSName : 0;
  pTab = sqlite3FindTable(db, z, zDb);
  if( pTab ){
    reindexTable(pParse, pTab, 0);
    sqlite3DbFree(db, z);
    return;
  }
  pIndex = sqlite3FindIndex(db, z, zDb);
  sqlite3DbFree(db, z);
  if( pIndex ){
    iDb = sqlite3SchemaToIndex(db, pIndex->pTable->pSchema);
    sqlite3BeginWriteOperation(pParse, 0, iDb);
    sqlite3RefillIndex(pParse, pIndex, -1);
    return;
  }
  sqlite3ErrorMsg(pParse, "unable to identify the object to be reindexed");
}